

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fib-lace.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  Task local_70;
  
  uVar3 = 1;
  iVar4 = 100000;
  while( true ) {
    while( true ) {
      while( true ) {
        iVar2 = getopt(argc,argv,"w:q:h");
        if (iVar2 << 0x18 == -0x1000000) {
          if (_optind != argc) {
            lace_start(uVar3,(long)iVar4);
            uVar3 = atoi(argv[_optind]);
            dVar5 = wctime();
            local_70.f = pfib_WRAP;
            local_70.thief = (_Worker *)0x1;
            local_70.d._0_4_ = uVar3;
            lace_run_task(&local_70);
            uVar1 = local_70.d._0_4_;
            dVar6 = wctime();
            printf("fib(%d) = %d\n",(ulong)uVar3,(ulong)(uint)uVar1);
            printf("Time: %f\n",dVar6 - dVar5);
            lace_stop();
            return 0;
          }
          usage(*argv);
          exit(1);
        }
        iVar2 = (iVar2 << 0x18) >> 0x18;
        if (iVar2 != 0x68) break;
        usage(*argv);
      }
      if (iVar2 != 0x71) break;
      iVar4 = atoi(_optarg);
    }
    if (iVar2 != 0x77) break;
    uVar3 = atoi(_optarg);
  }
  abort();
}

Assistant:

int main(int argc, char **argv)
{
    int workers = 1;
    int dqsize = 100000;

    char c;
    while ((c=getopt(argc, argv, "w:q:h")) != -1) {
        switch (c) {
            case 'w':
                workers = atoi(optarg);
                break;
            case 'q':
                dqsize = atoi(optarg);
                break;
            case 'h':
                usage(argv[0]);
                break;
            default:
                abort();
        }
    }

    if (optind == argc) {
        usage(argv[0]);
        exit(1);
    }

    lace_start(workers, dqsize);

    int n = atoi(argv[optind]);

    double t1 = wctime();
    int m = RUN(pfib, n);
    double t2 = wctime();

    printf("fib(%d) = %d\n", n, m);
    printf("Time: %f\n", t2-t1);

    lace_stop();
    return 0;
}